

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O0

void nn_ctcp_destroy(nn_epbase *self)

{
  nn_fsm *local_20;
  nn_ctcp *ctcp;
  nn_epbase *self_local;
  
  if (self == (nn_epbase *)0x0) {
    local_20 = (nn_fsm *)0x0;
  }
  else {
    local_20 = (nn_fsm *)(self + -6);
  }
  nn_dns_term((nn_dns *)&local_20[0x16].stopped.src);
  nn_stcp_term((nn_stcp *)&local_20[0xb].state);
  nn_backoff_term((nn_backoff *)&local_20[8].owner);
  nn_usock_term((nn_usock *)&local_20[1].srcptr);
  nn_fsm_term(local_20);
  nn_epbase_term((nn_epbase *)&local_20[1].shutdown_fn);
  nn_free(local_20);
  return;
}

Assistant:

static void nn_ctcp_destroy (struct nn_epbase *self)
{
    struct nn_ctcp *ctcp;

    ctcp = nn_cont (self, struct nn_ctcp, epbase);

    nn_dns_term (&ctcp->dns);
    nn_stcp_term (&ctcp->stcp);
    nn_backoff_term (&ctcp->retry);
    nn_usock_term (&ctcp->usock);
    nn_fsm_term (&ctcp->fsm);
    nn_epbase_term (&ctcp->epbase);

    nn_free (ctcp);
}